

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationPublishTime(HelicsPublication pub,HelicsTime val,HelicsError *err)

{
  HelicsPublication pvVar1;
  Time val_00;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a8631;
    }
    else {
      pvVar1 = (HelicsPublication)0x0;
      if (*pub == -0x684eff5b) {
        pvVar1 = pub;
      }
      if (*pub == -0x684eff5b || err == (HelicsError *)0x0) goto LAB_001a8633;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001a8631:
  pvVar1 = (HelicsPublication)0x0;
LAB_001a8633:
  if (pvVar1 != (HelicsPublication)0x0) {
    val_00.internalTimeCode = 0x7fffffffffffffff;
    if (val <= -9223372036.854765) {
      val_00.internalTimeCode = -0x7fffffffffffffff;
    }
    else if (val < 9223372036.854765) {
      val_00.internalTimeCode =
           (baseType)
           (val * 1000000000.0 + *(double *)(&DAT_00436020 + (ulong)(0.0 <= val * 1000000000.0) * 8)
           );
    }
    helics::Publication::publish(*(Publication **)((long)pvVar1 + 0x18),val_00);
  }
  return;
}

Assistant:

void helicsPublicationPublishTime(HelicsPublication pub, HelicsTime val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        const helics::Time tval(val);
        pubObj->pubPtr->publish(tval);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}